

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitRefEq(FunctionValidator *this,RefEq *curr)

{
  ulong uVar1;
  Shareability left;
  Shareability right;
  HeapType local_30;
  HeapType local_28;
  
  ValidationInfo::shouldBeTrue<wasm::RefEq*>
            (this->info,
             (bool)((byte)((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features >> 10) & 1),curr,
             "ref.eq requires gc [--enable-gc]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeSubTypeIgnoringShared
            (this->info,(Type)(curr->left->type).id,(Type)0x2a,curr->left,
             "ref.eq\'s left argument should be a subtype of eqref",(Function *)0x0);
  ValidationInfo::shouldBeSubTypeIgnoringShared
            (this->info,(Type)(curr->right->type).id,(Type)0x2a,curr->right,
             "ref.eq\'s right argument should be a subtype of eqref",(Function *)0x0);
  uVar1 = (curr->left->type).id;
  if (((uVar1 & 1) == 0 && 6 < uVar1) &&
     (uVar1 = (curr->right->type).id, (uVar1 & 1) == 0 && 6 < uVar1)) {
    local_30 = wasm::Type::getHeapType(&curr->left->type);
    left = HeapType::getShared(&local_30);
    local_28 = wasm::Type::getHeapType(&curr->right->type);
    right = HeapType::getShared(&local_28);
    ValidationInfo::shouldBeEqual<wasm::RefEq*,wasm::Shareability>
              (this->info,left,right,curr,"ref.eq operands must have the same shareability",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
  }
  return;
}

Assistant:

void FunctionValidator::visitRefEq(RefEq* curr) {
  Type eqref = Type(HeapType::eq, Nullable);
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "ref.eq requires gc [--enable-gc]");
  shouldBeSubTypeIgnoringShared(
    curr->left->type,
    eqref,
    curr->left,
    "ref.eq's left argument should be a subtype of eqref");
  shouldBeSubTypeIgnoringShared(
    curr->right->type,
    eqref,
    curr->right,
    "ref.eq's right argument should be a subtype of eqref");
  if (curr->left->type.isRef() && curr->right->type.isRef()) {
    shouldBeEqual(curr->left->type.getHeapType().getShared(),
                  curr->right->type.getHeapType().getShared(),
                  curr,
                  "ref.eq operands must have the same shareability");
  }
}